

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Intercom_Control_PDU::AddIntercomCommunicationParameters
          (Intercom_Control_PDU *this,IntercomCommunicationParameters *ICP)

{
  KUINT16 KVar1;
  
  KVar1 = DATA_TYPE::IntercomCommunicationParameters::GetLength(ICP);
  (this->super_Header).super_Header6.m_ui16PDULength =
       KVar1 + (this->super_Header).super_Header6.m_ui16PDULength + 4;
  std::
  vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
  ::push_back(&this->m_vICP,ICP);
  return;
}

Assistant:

void Intercom_Control_PDU::AddIntercomCommunicationParameters( const IntercomCommunicationParameters & ICP )
{
    m_ui16PDULength += ICP.GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    m_vICP.push_back( ICP );
}